

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::RenderHeatmap<unsigned_char,ImPlot::TransformerLogLog>
               (TransformerLogLog transformer,ImDrawList *DrawList,uchar *values,int rows,int cols,
               double scale_min,double scale_max,char *fmt,ImPlotPoint *bounds_min,
               ImPlotPoint *bounds_max)

{
  ImVec2 IVar1;
  undefined8 uVar2;
  double dVar3;
  double dVar4;
  ImPlotPlot *pIVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ImPlotContext *pIVar8;
  ImPlotContext *pIVar9;
  uchar *puVar10;
  ImU32 col;
  int iVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  ImVec4 IVar29;
  ImVec2 a;
  ImVec2 b;
  ImVec4 color;
  ImVec2 local_148;
  int local_13c;
  undefined1 local_138 [16];
  double local_128;
  undefined8 uStack_120;
  undefined1 local_118 [24];
  double local_100;
  double local_f8;
  uchar *local_f0;
  char *local_e8;
  long local_e0;
  double local_d8;
  long local_d0;
  ulong local_c8;
  double local_c0;
  ImDrawList *local_b8;
  double local_b0;
  undefined1 local_a8 [16];
  uchar *local_98;
  undefined8 uStack_90;
  double local_80;
  ulong local_78;
  ImPlotContext *local_70;
  double local_68;
  ImVec2 local_60;
  undefined1 local_58 [12];
  float fStack_4c;
  
  if (0 < rows) {
    dVar25 = (bounds_max->x - bounds_min->x) / (double)cols;
    local_f8 = (bounds_max->y - bounds_min->y) / (double)rows;
    dVar23 = dVar25 * 0.5;
    dVar27 = local_f8 * 0.5;
    lVar13 = (long)transformer.YAxis;
    local_b0 = scale_max - scale_min;
    local_c8 = (ulong)(uint)cols;
    uVar12 = 0;
    local_100 = local_f8 * 0.5;
    dVar26 = dVar25 * 0.5;
    local_d0 = lVar13 * 0x10;
    dVar28 = 0.0;
    iVar11 = 0;
    local_70 = GImPlot;
    local_f0 = values;
    local_e8 = fmt;
    local_e0 = lVar13;
    local_d8 = scale_min;
    local_c0 = dVar25;
    local_b8 = DrawList;
    local_68 = dVar26;
    do {
      puVar10 = local_f0;
      if (0 < cols) {
        dVar21 = local_f8 * dVar28 + local_100;
        dVar22 = 0.0;
        lVar15 = 0;
        local_13c = iVar11;
        local_80 = dVar28;
        local_78 = uVar12;
        do {
          pIVar8 = GImPlot;
          local_118._0_8_ = dVar22;
          local_128 = dVar22 * dVar25 + bounds_min->x + dVar26;
          dVar28 = bounds_max->y - dVar21;
          dVar25 = log10((local_128 - dVar23) / (GImPlot->CurrentPlot->XAxis).Range.Min);
          pIVar5 = pIVar8->CurrentPlot;
          local_a8._8_4_ = extraout_XMM0_Dc;
          local_a8._0_8_ = dVar25;
          local_a8._12_4_ = extraout_XMM0_Dd;
          local_98 = (uchar *)pIVar8->LogDenX;
          uStack_90 = 0;
          dVar25 = (pIVar5->XAxis).Range.Min;
          local_138._8_8_ = 0;
          local_138._0_8_ = (pIVar5->XAxis).Range.Max;
          dVar26 = log10((dVar28 - dVar27) / pIVar5->YAxis[lVar13].Range.Min);
          pIVar9 = GImPlot;
          pIVar5 = pIVar8->CurrentPlot;
          auVar17._8_8_ = dVar26;
          auVar17._0_8_ = local_a8._0_8_;
          auVar18._8_4_ = SUB84(pIVar8->LogDenY[lVar13],0);
          auVar18._0_8_ = local_98;
          auVar18._12_4_ = (int)((ulong)pIVar8->LogDenY[lVar13] >> 0x20);
          auVar18 = divpd(auVar17,auVar18);
          dVar26 = pIVar5->YAxis[lVar13].Range.Min;
          IVar1 = pIVar8->PixelRange[lVar13].Min;
          local_148.y = (float)(pIVar8->My[lVar13] *
                                (((double)(float)auVar18._8_8_ *
                                  (pIVar5->YAxis[lVar13].Range.Max - dVar26) + dVar26) - dVar26) +
                               (double)IVar1.y);
          local_148.x = (float)(pIVar8->Mx *
                                (((double)(float)auVar18._0_8_ * ((double)local_138._0_8_ - dVar25)
                                 + dVar25) - (pIVar5->XAxis).Range.Min) + (double)IVar1.x);
          dVar25 = log10((local_128 + dVar23) / (GImPlot->CurrentPlot->XAxis).Range.Min);
          pIVar5 = pIVar9->CurrentPlot;
          local_138._8_4_ = extraout_XMM0_Dc_00;
          local_138._0_8_ = dVar25;
          local_138._12_4_ = extraout_XMM0_Dd_00;
          dVar25 = pIVar9->LogDenX;
          dVar26 = (pIVar5->XAxis).Range.Min;
          local_128 = (pIVar5->XAxis).Range.Max;
          uStack_120 = 0;
          dVar28 = log10((dVar28 + dVar27) / pIVar5->YAxis[lVar13].Range.Min);
          pIVar8 = local_70;
          pIVar5 = pIVar9->CurrentPlot;
          auVar19._8_8_ = dVar28;
          auVar19._0_8_ = local_138._0_8_;
          auVar6._8_4_ = SUB84(pIVar9->LogDenY[lVar13],0);
          auVar6._0_8_ = dVar25;
          auVar6._12_4_ = (int)((ulong)pIVar9->LogDenY[lVar13] >> 0x20);
          auVar18 = divpd(auVar19,auVar6);
          dVar25 = pIVar5->YAxis[lVar13].Range.Min;
          IVar1 = pIVar9->PixelRange[lVar13].Min;
          local_60.y = (float)(pIVar9->My[lVar13] *
                               (((double)(float)auVar18._8_8_ *
                                 (pIVar5->YAxis[lVar13].Range.Max - dVar25) + dVar25) - dVar25) +
                              (double)IVar1.y);
          local_60.x = (float)(pIVar9->Mx *
                               (((double)(float)auVar18._0_8_ * (local_128 - dVar26) + dVar26) -
                               (pIVar5->XAxis).Range.Min) + (double)IVar1.x);
          IVar29 = LerpColormap((float)(((double)puVar10[lVar15 + (int)uVar12] - local_d8) /
                                        local_b0 + 0.0));
          local_58 = IVar29._0_12_;
          fStack_4c = IVar29.w * (pIVar8->Style).FillAlpha;
          col = ImGui::GetColorU32((ImVec4 *)local_58);
          ImDrawList::AddRectFilled(local_b8,&local_148,&local_60,col,0.0,0xf);
          dVar22 = (double)local_118._0_8_ + 1.0;
          lVar15 = lVar15 + 1;
          dVar25 = local_c0;
          dVar26 = local_68;
        } while ((int)local_c8 != (int)lVar15);
        uVar12 = (ulong)(uint)((int)local_78 + (int)lVar15);
        dVar28 = local_80;
        iVar11 = local_13c;
      }
      lVar15 = local_e0;
      dVar28 = dVar28 + 1.0;
      iVar11 = iVar11 + 1;
    } while (iVar11 != rows);
    if (local_e8 != (char *)0x0 && 0 < rows) {
      iVar11 = 0;
      dVar26 = 0.0;
      iVar14 = 0;
      do {
        if (0 < cols) {
          local_138._0_8_ = local_f8 * dVar26 + local_100;
          local_a8._0_4_ = iVar11;
          local_98 = local_f0 + iVar11;
          dVar28 = 0.0;
          lVar16 = 0;
          do {
            pIVar8 = GImPlot;
            dVar21 = (bounds_min->y + 1.0) - (double)local_138._0_8_;
            dVar27 = log10((dVar28 * dVar25 + bounds_min->x + dVar23) /
                           (GImPlot->CurrentPlot->XAxis).Range.Min);
            pIVar5 = pIVar8->CurrentPlot;
            local_128 = pIVar8->LogDenX;
            uStack_120 = 0;
            dVar25 = (pIVar5->XAxis).Range.Min;
            local_118._8_8_ = 0;
            local_118._0_8_ = (pIVar5->XAxis).Range.Max;
            dVar21 = log10(dVar21 / pIVar5->YAxis[lVar13].Range.Min);
            puVar10 = local_98;
            pIVar5 = pIVar8->CurrentPlot;
            auVar20._8_8_ = dVar21;
            auVar20._0_8_ = dVar27;
            auVar7._8_4_ = SUB84(pIVar8->LogDenY[lVar15],0);
            auVar7._0_8_ = local_128;
            auVar7._12_4_ = (int)((ulong)pIVar8->LogDenY[lVar15] >> 0x20);
            auVar18 = divpd(auVar20,auVar7);
            dVar27 = pIVar5->YAxis[lVar13].Range.Max;
            dVar21 = pIVar5->YAxis[lVar13].Range.Min;
            dVar24 = (double)local_118._0_8_ - dVar25;
            uVar2 = *(undefined8 *)((long)&pIVar8->PixelRange[0].Min.x + local_d0);
            dVar22 = (pIVar5->XAxis).Range.Min;
            dVar3 = pIVar8->Mx;
            dVar4 = pIVar8->My[lVar15];
            sprintf(local_58,local_e8,(ulong)local_98[lVar16]);
            IVar1 = ImGui::CalcTextSize(local_58,(char *)0x0,false,-1.0);
            local_118._8_4_ = extraout_XMM0_Dc_01;
            local_118._0_4_ = IVar1.x;
            local_118._4_4_ = IVar1.y;
            local_118._12_4_ = extraout_XMM0_Dd_01;
            IVar29 = LerpColormap((float)(((double)puVar10[lVar16] - local_d8) / local_b0 + 0.0));
            local_148.y = (float)local_118._4_4_ * -0.5 +
                          (float)(dVar4 * (((double)(float)auVar18._8_8_ * (dVar27 - dVar21) +
                                           dVar21) - dVar21) + (double)(float)((ulong)uVar2 >> 0x20)
                                 );
            local_148.x = (float)local_118._0_4_ * -0.5 +
                          (float)(dVar3 * (((double)(float)auVar18._0_8_ * dVar24 + dVar25) - dVar22
                                          ) + (double)(float)uVar2);
            ImDrawList::AddText(local_b8,&local_148,
                                -(uint)(IVar29.z * 0.114 + IVar29.x * 0.299 + IVar29.y * 0.587 <=
                                       0.5) | 0xff000000,local_58,(char *)0x0);
            dVar28 = dVar28 + 1.0;
            lVar16 = lVar16 + 1;
            dVar25 = local_c0;
          } while ((int)local_c8 != (int)lVar16);
          iVar11 = local_a8._0_4_ + (int)lVar16;
        }
        dVar26 = dVar26 + 1.0;
        iVar14 = iVar14 + 1;
      } while (iVar14 != rows);
    }
  }
  return;
}

Assistant:

void RenderHeatmap(Transformer transformer, ImDrawList& DrawList, const T* values, int rows, int cols, double scale_min, double scale_max, const char* fmt, const ImPlotPoint& bounds_min, const ImPlotPoint& bounds_max) {
    ImPlotContext& gp = *GImPlot;
    const double w = (bounds_max.x - bounds_min.x) / cols;
    const double h = (bounds_max.y - bounds_min.y) / rows;
    const ImPlotPoint half_size(w*0.5,h*0.5);
    int i = 0;
    for (int r = 0; r < rows; ++r) {
        for (int c = 0; c < cols; ++c) {
            ImPlotPoint p;
            p.x = bounds_min.x + 0.5*w + c*w;
            p.y = bounds_max.y - (0.5*h + r*h);
            ImVec2 a  = transformer(ImPlotPoint(p.x - half_size.x, p.y - half_size.y));
            ImVec2 b  = transformer(ImPlotPoint(p.x + half_size.x, p.y + half_size.y));
            double t = ImRemap((double)values[i], scale_min, scale_max, 0.0, 1.0);
            ImVec4 color = LerpColormap((float)t);
            color.w *= gp.Style.FillAlpha;
            ImU32 col = ImGui::GetColorU32(color);
            DrawList.AddRectFilled(a, b, col);
            i++;
        }
    }
    if (fmt != NULL) {
        i = 0;
        for (int r = 0; r < rows; ++r) {
            for (int c = 0; c < cols; ++c) {
                ImPlotPoint p;
                p.x = bounds_min.x + 0.5*w + c*w;
                p.y = bounds_min.y + 1 - (0.5*h + r*h);
                ImVec2 px = transformer(p);
                char buff[32];
                sprintf(buff, fmt, values[i]);
                ImVec2 size = ImGui::CalcTextSize(buff);
                double t = ImRemap((double)values[i], scale_min, scale_max, 0.0, 1.0);
                ImVec4 color = LerpColormap((float)t);
                ImU32 col = CalcTextColor(color);
                DrawList.AddText(px - size * 0.5f, col, buff);
                i++;
            }
        }
    }
}